

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

void emtlst(emtcxdef *ctx,uint ofs,uchar *base)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  emtcxdef *ctx_00;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint oplen;
  uchar dat;
  emtledef *ele;
  emtlidef *lst;
  ushort i;
  uint initofs;
  ushort in_stack_ffffffffffffffbe;
  emtcxdef *in_stack_ffffffffffffffc0;
  char local_31;
  uint *local_30;
  undefined2 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = (uint)*(ushort *)(in_RDI + 0x12);
  emtres(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  oswp2((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),2);
  *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 2;
  if (in_ESI != 0) {
    uVar4 = *(uint *)(in_RDX + (ulong)in_ESI);
    local_30 = (uint *)(in_RDX + (ulong)in_ESI) + (long)(int)((uVar4 & 0xffff) - 1) * 4 + 2;
    for (sVar2 = (short)uVar4; sVar2 != 0; sVar2 = sVar2 + -1) {
      ctx_00 = (emtcxdef *)(ulong)((byte)*local_30 - 0x36);
      switch(ctx_00) {
      case (emtcxdef *)0x0:
        uVar4 = osrp2((void *)(in_RDX + *(long *)(local_30 + 2)));
        emtres(ctx_00,in_stack_ffffffffffffffbe);
        uVar1 = *(ushort *)(in_RDI + 0x12);
        *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
        *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 3;
        emtres(ctx_00,in_stack_ffffffffffffffbe);
        memcpy((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
               (void *)(in_RDX + *(long *)(local_30 + 2)),(ulong)uVar4);
        *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + (short)uVar4;
        goto LAB_00131861;
      case (emtcxdef *)0x1:
        local_31 = '\x01';
        break;
      default:
        break;
      case (emtcxdef *)0xa:
        local_31 = '\r';
        goto LAB_00131747;
      case (emtcxdef *)0x10:
        local_31 = '\n';
        goto LAB_00131747;
      case (emtcxdef *)0x13:
        local_31 = '\x02';
        goto LAB_00131747;
      case (emtcxdef *)0x16:
        emtres(ctx_00,in_stack_ffffffffffffffbe);
        uVar1 = *(ushort *)(in_RDI + 0x12);
        *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
        *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = 7;
        emtlst((emtcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDX >> 0x20),
               (uchar *)CONCAT44(uVar3,CONCAT22(sVar2,in_stack_ffffffffffffffe0)));
        goto LAB_00131861;
      case (emtcxdef *)0x17:
        local_31 = '\x05';
        break;
      case (emtcxdef *)0x18:
        local_31 = '\b';
        break;
      case (emtcxdef *)0x1f:
        local_31 = '\r';
LAB_00131747:
        emtres(ctx_00,in_stack_ffffffffffffffbe);
        uVar1 = *(ushort *)(in_RDI + 0x12);
        *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
        *(char *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = local_31;
        emtres(ctx_00,in_stack_ffffffffffffffbe);
        oswp2((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
              (uint)*(undefined8 *)(local_30 + 2) & 0xffff);
        *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 2;
        goto LAB_00131861;
      }
      emtres(ctx_00,in_stack_ffffffffffffffbe);
      uVar1 = *(ushort *)(in_RDI + 0x12);
      *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
      *(char *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = local_31;
      if ((local_31 != '\b') && (local_31 != '\x05')) {
        emtres(ctx_00,in_stack_ffffffffffffffbe);
        oswp4s((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),
               *(long *)(local_30 + 2));
        *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 4;
      }
LAB_00131861:
      local_30 = local_30 + -4;
    }
    oswp2((void *)(*(long *)(in_RDI + 0x18) + (ulong)uVar3),*(ushort *)(in_RDI + 0x12) - uVar3);
  }
  return;
}

Assistant:

void emtlst(emtcxdef *ctx, uint ofs, uchar *base)
{
    uint      initofs;
    ushort    i;
    emtlidef *lst;
    emtledef *ele;
        
    initofs = ctx->emtcxofs;                        /* save starting offset */
    emtint2(ctx, 2);                             /* emit placeholder length */
    if (ofs == 0) return;              /* nothing more to do for empty list */

    lst = (emtlidef *)(base + ofs);

    for (i = lst->emtlicnt, ele = &lst->emtliele[i-1] ; i ; --ele, --i)
    {
        uchar dat;
        
        switch(ele->emtletyp)
        {
        case TOKTLIST:
            emtbyte(ctx, DAT_LIST);
            emtlst(ctx, (uint)ele->emtleval, base);
            continue;

        case TOKTSSTRING:
        {
            uint oplen = osrp2(base + ele->emtleval);
            
            emtbyte(ctx, DAT_SSTRING);
            emtmem(ctx, base + ele->emtleval, oplen);
            continue;
        }

        case TOKTNUMBER:
            dat = DAT_NUMBER;
            break;
        case TOKTNIL:
            dat = DAT_NIL;
            break;
        case TOKTTRUE:
            dat = DAT_TRUE;
            break;

        case TOKTPOUND:
            dat = DAT_PROPNUM;
            goto symbol;
        case TOKTFUNCTION:
            dat = DAT_FNADDR;
            goto symbol;
        case TOKTOBJECT:
            dat = DAT_OBJECT;
            goto symbol;
        case TOKTDOT:
            dat = DAT_PROPNUM;
            /* FALLTHROUGH */
        symbol:
            emtbyte(ctx, dat);
            emtint2(ctx, (ushort)ele->emtleval);
            continue;

        default:
            assert(FALSE);
            break;
        }
        
        /* if we get here, emit datatype in dat, plus value */
        emtbyte(ctx, dat);
        if (dat != DAT_TRUE && dat != DAT_NIL)
            emtint4(ctx, ele->emtleval);
    }
    oswp2(ctx->emtcxptr + initofs, ctx->emtcxofs - initofs);
}